

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Fts3NextToken(char *zStr,int *pn)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char *pcStack_30;
  char c;
  char *z2;
  char *z1;
  int *pn_local;
  char *zStr_local;
  
  pcStack_30 = (char *)0x0;
  z2 = zStr;
  do {
    while( true ) {
      if (pcStack_30 != (char *)0x0) {
        *pn = (int)pcStack_30 - (int)z2;
        return z2;
      }
      cVar1 = *z2;
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      if ((cVar1 != '\"') && (cVar1 != '\'')) break;
LAB_001fc6fd:
      pcStack_30 = z2;
      do {
        pcVar4 = pcStack_30 + 1;
        bVar5 = false;
        if ((pcStack_30[1] != '\0') && (bVar5 = true, *pcVar4 == cVar1)) {
          bVar5 = pcStack_30[2] == cVar1;
          pcVar4 = pcStack_30 + 2;
        }
        pcStack_30 = pcVar4;
      } while (bVar5);
    }
    pcVar4 = z2;
    if (cVar1 == '[') {
      do {
        pcVar2 = pcVar4;
        pcStack_30 = pcVar2 + 1;
        bVar5 = false;
        if (*pcStack_30 != '\0') {
          bVar5 = *pcStack_30 != ']';
        }
        pcVar4 = pcStack_30;
      } while (bVar5);
      if (*pcStack_30 != '\0') {
        pcStack_30 = pcVar2 + 2;
      }
    }
    else {
      if (cVar1 == '`') goto LAB_001fc6fd;
      iVar3 = sqlite3Fts3IsIdChar(*z2);
      if (iVar3 == 0) {
        z2 = z2 + 1;
      }
      else {
        do {
          pcStack_30 = pcVar4 + 1;
          iVar3 = sqlite3Fts3IsIdChar(*pcStack_30);
          pcVar4 = pcStack_30;
        } while (iVar3 != 0);
      }
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE const char *sqlite3Fts3NextToken(const char *zStr, int *pn){
  const char *z1;
  const char *z2 = 0;

  /* Find the start of the next token. */
  z1 = zStr;
  while( z2==0 ){
    char c = *z1;
    switch( c ){
      case '\0': return 0;        /* No more tokens here */
      case '\'':
      case '"':
      case '`': {
        z2 = z1;
        while( *++z2 && (*z2!=c || *++z2==c) );
        break;
      }
      case '[':
        z2 = &z1[1];
        while( *z2 && z2[0]!=']' ) z2++;
        if( *z2 ) z2++;
        break;

      default:
        if( sqlite3Fts3IsIdChar(*z1) ){
          z2 = &z1[1];
          while( sqlite3Fts3IsIdChar(*z2) ) z2++;
        }else{
          z1++;
        }
    }
  }

  *pn = (int)(z2-z1);
  return z1;
}